

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi_aggregate_functions.cpp
# Opt level: O3

void RepeatedStringAggCombine
               (duckdb_function_info info,duckdb_aggregate_state *source_p,
               duckdb_aggregate_state *target_p,idx_t count)

{
  size_t __n;
  long lVar1;
  long lVar2;
  void *__dest;
  duckdb_aggregate_state p_Var3;
  idx_t iVar4;
  duckdb_aggregate_state p_Var5;
  
  if (count != 0) {
    iVar4 = 0;
    do {
      p_Var5 = source_p[iVar4];
      if (*(long *)(p_Var5 + 8) != 0) {
        p_Var3 = target_p[iVar4];
        __n = *(size_t *)(p_Var3 + 8);
        __dest = malloc(*(long *)(p_Var5 + 8) + __n + 1);
        if (__n != 0) {
          memcpy(__dest,*(void **)p_Var3,__n);
        }
        if (*(void **)p_Var3 != (void *)0x0) {
          free(*(void **)p_Var3);
          p_Var3 = target_p[iVar4];
          p_Var5 = source_p[iVar4];
        }
        memcpy((void *)(*(long *)(p_Var3 + 8) + (long)__dest),*(void **)p_Var5,
               *(size_t *)(p_Var5 + 8));
        *(void **)p_Var3 = __dest;
        p_Var5 = target_p[iVar4];
        lVar1 = *(long *)(p_Var5 + 8);
        lVar2 = *(long *)(source_p[iVar4] + 8);
        *(long *)(p_Var5 + 8) = lVar1 + lVar2;
        *(undefined1 *)(*(long *)p_Var5 + lVar1 + lVar2) = 0;
      }
      iVar4 = iVar4 + 1;
    } while (count != iVar4);
  }
  return;
}

Assistant:

void RepeatedStringAggCombine(duckdb_function_info info, duckdb_aggregate_state *source_p,
                              duckdb_aggregate_state *target_p, idx_t count) {
	auto source = reinterpret_cast<RepeatedStringAggState **>(source_p);
	auto target = reinterpret_cast<RepeatedStringAggState **>(target_p);

	for (idx_t i = 0; i < count; i++) {
		if (source[i]->size == 0) {
			continue;
		}
		auto new_data = (char *)malloc(target[i]->size + source[i]->size + 1);
		if (target[i]->size > 0) {
			memcpy((void *)new_data, target[i]->data, target[i]->size);
		}
		if (target[i]->data) {
			free((void *)target[i]->data);
		}
		memcpy((void *)(new_data + target[i]->size), source[i]->data, source[i]->size);
		target[i]->data = new_data;
		target[i]->size += source[i]->size;
		target[i]->data[target[i]->size] = '\0';
	}
}